

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O1

string * __thiscall
flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Type *type,bool element_type,bool enum_inner)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  Enum *pEVar3;
  long *plVar4;
  Object *pOVar5;
  ulong uVar6;
  undefined7 in_register_00000009;
  long lVar7;
  size_type *psVar8;
  ulong *puVar9;
  BaseType base_type;
  char *pcVar10;
  char *pcVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  uint uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string importns;
  string type_name;
  string local_90;
  string local_70;
  string local_50;
  
  lVar7 = -(long)*(int *)type;
  uVar14 = 0;
  uVar2 = 0;
  if ((int)CONCAT71(in_register_00000009,element_type) == 0) {
    if (4 < *(ushort *)(type + -(long)*(int *)type)) {
      uVar2 = *(ushort *)(type + lVar7 + 4);
    }
  }
  else if (6 < *(ushort *)(type + -(long)*(int *)type)) {
    uVar2 = *(ushort *)(type + lVar7 + 6);
  }
  if (uVar2 != 0) {
    uVar14 = (uint)(char)type[uVar2].super_Table;
  }
  if (0xb < uVar14 - 1) {
LAB_00337477:
    switch(uVar14) {
    case 0xd:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "string";
      pcVar10 = "";
      break;
    case 0xe:
      GenerateType_abi_cxx11_(&local_50,this,type,true,enum_inner);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x38a3c3);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_70.field_2._M_allocated_capacity = *puVar9;
        local_70.field_2._8_8_ = plVar4[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *puVar9;
        local_70._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_70._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar8) {
        lVar7 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00337840:
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0033784d;
    case 0xf:
      pOVar5 = BaseBfbsGenerator::GetObject((BaseBfbsGenerator *)this,type,element_type);
      local_70._M_string_length = 0;
      local_70.field_2._M_allocated_capacity =
           local_70.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (*(ushort *)(pOVar5 + -(long)*(int *)pOVar5) < 5) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(pOVar5 + (4 - (long)*(int *)pOVar5));
      }
      uVar6 = (ulong)uVar2;
      paVar1 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,pOVar5 + *(uint *)(pOVar5 + uVar6) + uVar6 + 4,
                 pOVar5 + (ulong)*(uint *)(pOVar5 + *(uint *)(pOVar5 + uVar6) + uVar6) +
                          *(uint *)(pOVar5 + uVar6) + uVar6 + 4);
      anon_unknown_0::NimBfbsGenerator::Denamespace
                (&local_50,(NimBfbsGenerator *)this,&local_90,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pOVar5 == *(Object **)((long)this + 0xb8)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                        local_50.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                        local_50.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = local_50._M_string_length;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)&local_90);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar8) {
          lVar7 = plVar4[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        }
        __return_storage_ptr__->_M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      uVar12 = local_70.field_2._M_allocated_capacity;
      _Var13._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_003378eb;
    case 0x10:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Vtable";
      pcVar10 = "";
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "uoffset";
      pcVar10 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar11,pcVar10);
    return __return_storage_ptr__;
  }
  pEVar3 = BaseBfbsGenerator::GetEnum((BaseBfbsGenerator *)this,type,element_type);
  if (pEVar3 != (Enum *)0x0) {
    local_70._M_string_length = 0;
    local_70.field_2._M_allocated_capacity =
         local_70.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (*(ushort *)(pEVar3 + -(long)*(int *)pEVar3) < 5) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(pEVar3 + (4 - (long)*(int *)pEVar3));
    }
    uVar6 = (ulong)uVar2;
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pEVar3 + *(uint *)(pEVar3 + uVar6) + uVar6 + 4,
               pEVar3 + (ulong)*(uint *)(pEVar3 + *(uint *)(pEVar3 + uVar6) + uVar6) +
                        *(uint *)(pEVar3 + uVar6) + uVar6 + 4);
    anon_unknown_0::NimBfbsGenerator::Denamespace
              (&local_50,(NimBfbsGenerator *)this,&local_90,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_50._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar8) {
      lVar7 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    uVar12 = local_70.field_2._M_allocated_capacity;
    _Var13._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_003378eb;
  }
  if (0xb < uVar14 - 1) goto LAB_00337477;
  GenerateType_abi_cxx11_(&local_50,(void *)(ulong)uVar14,base_type);
  local_70._M_string_length = 0;
  local_70.field_2._M_allocated_capacity =
       local_70.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  anon_unknown_0::NimBfbsGenerator::Denamespace
            (__return_storage_ptr__,(NimBfbsGenerator *)this,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00337840;
LAB_0033784d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return __return_storage_ptr__;
  }
  uVar12 = CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
  _Var13._M_p = local_50._M_dataplus._M_p;
LAB_003378eb:
  operator_delete(_Var13._M_p,uVar12 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateType(const r::Type *type, bool element_type = false,
                           bool enum_inner = false) const {
    const r::BaseType base_type =
        element_type ? type->element() : type->base_type();
    if (IsScalar(base_type) && !enum_inner) {
      const r::Enum *type_enum = GetEnum(type, element_type);
      if (type_enum != nullptr) {
        std::string importns;
        std::string type_name = Denamespace(type_enum->name()->str(), importns);
        return importns + "." + type_name;
      }
    }
    if (IsScalar(base_type)) { return Denamespace(GenerateType(base_type)); }
    switch (base_type) {
      case r::String: return "string";
      case r::Vector: {
        return "seq[" + GenerateType(type, true) + "]";
      }
      case r::Union: return "Vtable";
      case r::Obj: {
        const r::Object *type_obj = GetObject(type, element_type);
        std::string importns;
        std::string type_name = Denamespace(type_obj->name()->str(), importns);
        if (type_obj == current_obj_) {
          return type_name;
        } else {
          return importns + "." + type_name;
        }
      }
      default: return "uoffset";
    }
  }